

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O3

int __thiscall JetHead::CircularBuffer::byteAt(CircularBuffer *this,int i)

{
  uint uVar1;
  byte *pbVar2;
  int size;
  int local_4;
  
  pbVar2 = getBytes(this,i,&local_4);
  if (pbVar2 == (byte *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = (uint)*pbVar2;
  }
  return uVar1;
}

Assistant:

int	CircularBuffer::byteAt( int i ) const
{
	int size;
	const uint8_t *res = getBytes( i, size );

	if ( res == NULL )
		return -1;
	else
		return *res;
}